

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O2

QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::FourierMotzkinConf::Lhs> __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::
Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::TriInf<Inferences::ALASCA::IntegerFourierMotzkinConf<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::QueryBank<1U,_0U>_>_>
::next(Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::TriInf<Inferences::ALASCA::IntegerFourierMotzkinConf<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::QueryBank<1U,_0U>_>_>
       *this)

{
  char cVar1;
  bool bVar2;
  SelectedSummand *this_00;
  TypedTermList t;
  QueryRes<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::FourierMotzkinConf::Lhs> QVar3;
  Renaming normalizer;
  Renaming local_40;
  
  do {
    if ((this->_leafData).
        super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>_>.
        _isSome == true) {
      cVar1 = (**(code **)(*(long *)(this->_leafData).
                                    super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>_>
                                    ._elem._elem + 0x10))();
      if (cVar1 != '\0') break;
    }
    bVar2 = findNextLeaf(this);
  } while (bVar2);
  this_00 = (SelectedSummand *)
            (**(code **)(*(long *)(this->_leafData).
                                  super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>_>
                                  ._elem._elem + 0x18))();
  if (this->_retrieveSubstitution == true) {
    local_40._data._timestamp = 1;
    local_40._data._size = 0;
    local_40._data._deleted = 0;
    local_40._data._capacityIndex = 0;
    local_40._data._capacity = 0;
    local_40._data._20_8_ = 0;
    local_40._data._28_8_ = 0;
    local_40._36_8_ = 0;
    local_40._identity = true;
    t = Kernel::SelectedSummand::key(this_00);
    Kernel::Renaming::normalizeVariables(&local_40,t);
    RetrievalAlgorithms::
    UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::TriInf<Inferences::ALASCA::IntegerFourierMotzkinConf<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::QueryBank<1U,_0U>_>
    ::bdRecord(&this->_algo,&this->_normalizationBacktrackData);
    this->_normalizationRecording = true;
    RetrievalAlgorithms::
    UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Inferences::ALASCA::TriInf<Inferences::ALASCA::IntegerFourierMotzkinConf<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::QueryBank<1U,_0U>_>
    ::denormalize(&this->_algo,&local_40);
    Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::~DHMap
              (&local_40._data);
  }
  QVar3.data = (Lhs *)this_00;
  QVar3.unifier = (this->_algo)._unif;
  return QVar3;
}

Assistant:

QueryRes<Unifier, LeafData> next()
      {
        while(!hasLeafData() && findNextLeaf()) {}
        ASS(hasLeafData());

        ASS(!_normalizationRecording);

        auto ld = _leafData->next();
        if (_retrieveSubstitution) {
            Renaming normalizer;
            normalizer.normalizeVariables(ld->key());

            ASS(_normalizationBacktrackData.isEmpty());
            _algo.bdRecord(_normalizationBacktrackData);
            _normalizationRecording=true;

            _algo.denormalize(normalizer);
        }

        DEBUG_QUERY(1, "leaf data: ", *ld)
        return QueryRes(_algo.unifier(), ld);
      }